

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O1

QSize __thiscall QToolBarAreaLayoutLine::minimumSize(QToolBarAreaLayoutLine *this)

{
  QToolBarAreaLayoutItem *this_00;
  Orientation OVar1;
  QToolBarAreaLayoutItem *pQVar2;
  QLayoutItem *pQVar3;
  int iVar4;
  QSize QVar5;
  uint uVar6;
  Representation RVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  
  if ((this->toolBarItems).d.size == 0) {
    uVar6 = 0;
    uVar10 = 0;
  }
  else {
    lVar8 = 0;
    uVar9 = 0;
    uVar10 = 0;
    uVar6 = 0;
    do {
      pQVar2 = (this->toolBarItems).d.ptr;
      this_00 = (QToolBarAreaLayoutItem *)((long)&pQVar2->widgetItem + lVar8);
      RVar7.m_i = uVar6;
      if (((&pQVar2->gap)[lVar8] != false) ||
         ((pQVar3 = this_00->widgetItem, pQVar3 != (QLayoutItem *)0x0 &&
          (iVar4 = (*pQVar3->_vptr_QLayoutItem[8])(), (char)iVar4 == '\0')))) {
        QVar5 = QToolBarAreaLayoutItem::minimumSize(this_00);
        RVar7.m_i = QVar5.ht.m_i.m_i;
        if (this->o == Horizontal) {
          RVar7.m_i = QVar5.wd.m_i.m_i;
        }
        uVar10 = uVar10 + RVar7.m_i;
        RVar7.m_i = QVar5.ht.m_i.m_i;
        if (this->o == Vertical) {
          RVar7.m_i = QVar5.wd.m_i.m_i;
        }
        if (RVar7.m_i < (int)uVar6) {
          RVar7.m_i = uVar6;
        }
      }
      uVar6 = RVar7.m_i;
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x18;
    } while (uVar9 < (ulong)(this->toolBarItems).d.size);
  }
  OVar1 = this->o;
  uVar9 = 0xffffffff;
  if (OVar1 == Horizontal) {
    uVar9 = (ulong)uVar10;
  }
  if (OVar1 != Vertical) {
    uVar10 = uVar6;
  }
  if (OVar1 == Vertical) {
    uVar9 = (ulong)uVar6;
  }
  return (QSize)(uVar9 | (ulong)uVar10 << 0x20);
}

Assistant:

QSize QToolBarAreaLayoutLine::minimumSize() const
{
    int a = 0, b = 0;
    for (int i = 0; i < toolBarItems.size(); ++i) {
        const QToolBarAreaLayoutItem &item = toolBarItems[i];
        if (item.skip())
            continue;

        QSize ms = item.minimumSize();
        a += pick(o, ms);
        b = qMax(b, perp(o, ms));
    }

    QSize result;
    rpick(o, result) = a;
    rperp(o, result) = b;

    return result;
}